

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

Point3fi * __thiscall
pbrt::Transform::operator()(Point3fi *__return_storage_ptr__,Transform *this,Point3fi *p)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  float fVar7;
  float fVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Interval<float> IVar34;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auStack_98 [8];
  Tuple3<pbrt::Vector3,_float> local_90;
  Interval<float> local_80;
  undefined1 local_78 [16];
  Interval<float> local_68;
  undefined8 uStack_60;
  Interval<float> local_58;
  undefined8 uStack_50;
  Point3fi local_40;
  Point3f local_24;
  undefined1 extraout_var [56];
  
  bVar12 = &stack0x00000000 != (undefined1 *)0x98;
  bVar11 = (POPCOUNT((ulong)auStack_98 & 0xff) & 1U) == 0;
  FVar1 = (this->m).m[0][0];
  FVar2 = (this->m).m[0][2];
  FVar3 = (this->m).m[0][3];
  FVar4 = (this->m).m[1][0];
  FVar5 = (this->m).m[1][2];
  FVar6 = (this->m).m[1][3];
  fVar7 = (this->m).m[2][0];
  fVar8 = (this->m).m[2][2];
  FVar9 = (this->m).m[2][3];
  auVar27 = vinsertps_avx512f(*(undefined1 (*) [16])((this->m).m[0] + 1),
                              ZEXT416((uint)(this->m).m[1][1]),0x10);
  auVar14 = ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low);
  auVar16 = ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high);
  auVar13 = vaddss_avx512f(auVar14,auVar16);
  vsubss_avx512f(auVar16,auVar14);
  auVar16 = ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low);
  auVar17 = ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high);
  auVar14 = vsubss_avx512f(auVar17,auVar16);
  auVar15 = vmulss_avx512f(auVar13,ZEXT416(0x3f000000));
  auVar13 = vaddss_avx512f(auVar16,auVar17);
  auVar17 = ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low);
  auVar18 = ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high);
  auVar16 = vsubss_avx512f(auVar18,auVar17);
  auVar13 = vmulss_avx512f(auVar13,ZEXT416(0x3f000000));
  auVar17 = vaddss_avx512f(auVar17,auVar18);
  auVar18 = vbroadcastss_avx512vl(auVar13);
  auVar37 = ZEXT416((uint)(this->m).m[2][1]);
  auVar19 = vmulss_avx512f(auVar13,auVar37);
  auVar13 = vmulss_avx512f(auVar13,ZEXT416((uint)(this->m).m[3][1]));
  auVar30 = ZEXT416(0x3f000000);
  auVar20 = vmulss_avx512f(auVar17,auVar30);
  auVar21 = vfmadd213ss_avx512f(ZEXT416((uint)(this->m).m[3][2]),auVar20,
                                ZEXT416((uint)(this->m).m[3][3]));
  auVar22 = vmulps_avx512vl(auVar18,auVar27);
  auVar23 = vfmadd231ss_avx512f(auVar13,auVar15,ZEXT416((uint)(this->m).m[3][0]));
  auVar17 = vfmadd213ss_fma(auVar20,ZEXT416((uint)FVar2),ZEXT416((uint)FVar3));
  auVar24 = vfmadd213ss_avx512f(auVar20,ZEXT416((uint)FVar5),ZEXT416((uint)FVar6));
  auVar18 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar7),auVar19);
  auVar10 = vfmadd213ss_fma(auVar20,ZEXT416((uint)fVar8),ZEXT416((uint)FVar9));
  auVar13 = vmovshdup_avx(auVar22);
  auVar25 = vfmadd213ss_avx512f(auVar15,ZEXT416((uint)FVar1),auVar22);
  auVar26 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)FVar4),auVar15);
  vaddss_avx512f(auVar23,auVar21);
  auVar21 = vxorps_avx512vl(auVar23,auVar23);
  auVar13 = vucomiss_avx512f(auVar21);
  fVar36 = auVar15._0_4_;
  if (((((bVar12) || (bVar11)) || (auVar14 = vucomiss_avx512f(auVar21), bVar12)) ||
      ((bVar11 || (auVar16 = vucomiss_avx512f(auVar21), bVar12)))) || (bVar11)) {
    auVar21 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar23 = vbroadcastss_avx512vl(auVar15);
    auVar15 = vinsertps_avx512f(ZEXT416((uint)FVar1),ZEXT416((uint)FVar4),0x10);
    auVar28 = vmulss_avx512f(auVar13,auVar30);
    auVar29 = vmulss_avx512f(auVar14,auVar30);
    auVar16 = vmulss_avx512f(auVar16,auVar30);
    auVar13 = vinsertps_avx512f(ZEXT416((uint)FVar2),ZEXT416((uint)FVar5),0x10);
    auVar14 = vinsertps_avx512f(ZEXT416((uint)FVar3),ZEXT416((uint)FVar6),0x10);
    auVar30 = vbroadcastss_avx512vl(auVar29);
    auVar31 = vandps_avx512vl(auVar15,auVar21);
    auVar15 = vmulps_avx512vl(auVar23,auVar15);
    auVar23 = vbroadcastss_avx512vl(auVar20);
    auVar32 = vandps_avx512vl(auVar13,auVar21);
    auVar22 = vandps_avx512vl(auVar22,auVar21);
    auVar27 = vandps_avx512vl(auVar27,auVar21);
    auVar14 = vandps_avx512vl(auVar14,auVar21);
    auVar33 = vandps_avx512vl(ZEXT416((uint)(fVar7 * fVar36)),auVar21);
    auVar19 = vandps_avx512vl(auVar19,auVar21);
    auVar27 = vmulps_avx512vl(auVar27,auVar30);
    auVar30 = vbroadcastss_avx512vl(auVar28);
    auVar13 = vmulps_avx512vl(auVar23,auVar13);
    auVar15 = vandps_avx512vl(auVar15,auVar21);
    auVar20 = vandps_avx512vl(ZEXT416((uint)(fVar8 * auVar20._0_4_)),auVar21);
    auVar15 = vaddps_avx512vl(auVar15,auVar22);
    auVar27 = vfmadd213ps_avx512vl(auVar30,auVar31,auVar27);
    auVar22 = vbroadcastss_avx512vl(auVar16);
    auVar23 = vandps_avx512vl(ZEXT416((uint)FVar9),auVar21);
    auVar13 = vandps_avx512vl(auVar13,auVar21);
    auVar22 = vfmadd213ps_avx512vl(auVar22,auVar32,auVar27);
    auVar30._0_4_ = auVar14._0_4_ + auVar15._0_4_ + auVar13._0_4_;
    auVar30._4_4_ = auVar14._4_4_ + auVar15._4_4_ + auVar13._4_4_;
    auVar30._8_4_ = auVar14._8_4_ + auVar15._8_4_ + auVar13._8_4_;
    auVar30._12_4_ = auVar14._12_4_ + auVar15._12_4_ + auVar13._12_4_;
    auVar13._8_4_ = 0x34400002;
    auVar13._0_8_ = 0x3440000234400002;
    auVar13._12_4_ = 0x34400002;
    auVar13 = vmulps_avx512vl(auVar30,auVar13);
    auVar27 = vandps_avx512vl(auVar37,auVar21);
    auVar14 = vmulss_avx512f(auVar27,auVar29);
    auVar27._8_4_ = 0x3f800002;
    auVar27._0_8_ = 0x3f8000023f800002;
    auVar27._12_4_ = 0x3f800002;
    auVar13 = vfmadd231ps_avx512vl(auVar13,auVar22,auVar27);
    local_90._0_8_ = vmovlps_avx(auVar13);
    auVar13 = vandps_avx512vl(ZEXT416((uint)fVar7),auVar21);
    auVar13 = vfmadd231ss_avx512f(auVar14,auVar28,auVar13);
    auVar27 = vandps_avx512vl(ZEXT416((uint)fVar8),auVar21);
    auVar13 = vfmadd213ss_avx512f(auVar27,auVar16,auVar13);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((auVar23._0_4_ +
                                             auVar19._0_4_ + auVar33._0_4_ + auVar20._0_4_) *
                                            1.7881396e-07)),auVar13,ZEXT416(0x3f800002));
    local_90.z = auVar13._0_4_;
  }
  else {
    auVar13 = vinsertps_avx512f(ZEXT416((uint)FVar1),ZEXT416((uint)FVar4),0x10);
    auVar16 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar21._4_4_ = fVar36;
    auVar21._0_4_ = fVar36;
    auVar21._8_4_ = fVar36;
    auVar21._12_4_ = fVar36;
    auVar15 = vbroadcastss_avx512vl(auVar20);
    auVar27 = vinsertps_avx512f(ZEXT416((uint)FVar2),ZEXT416((uint)FVar5),0x10);
    auVar14 = vinsertps_avx512f(ZEXT416((uint)FVar3),ZEXT416((uint)FVar6),0x10);
    auVar13 = vmulps_avx512vl(auVar21,auVar13);
    auVar27 = vmulps_avx512vl(auVar15,auVar27);
    auVar15 = vandps_avx512vl(auVar22,auVar16);
    auVar13 = vandps_avx512vl(auVar13,auVar16);
    auVar21 = vandps_avx512vl(ZEXT416((uint)(fVar7 * fVar36)),auVar16);
    auVar19 = vandps_avx512vl(auVar19,auVar16);
    auVar20 = vandps_avx512vl(ZEXT416((uint)(fVar8 * auVar20._0_4_)),auVar16);
    auVar14 = vandps_avx512vl(auVar14,auVar16);
    auVar27 = vandps_avx512vl(auVar27,auVar16);
    auVar16 = vandps_avx512vl(ZEXT416((uint)FVar9),auVar16);
    auVar22._0_4_ = auVar14._0_4_ + auVar13._0_4_ + auVar15._0_4_ + auVar27._0_4_;
    auVar22._4_4_ = auVar14._4_4_ + auVar13._4_4_ + auVar15._4_4_ + auVar27._4_4_;
    auVar22._8_4_ = auVar14._8_4_ + auVar13._8_4_ + auVar15._8_4_ + auVar27._8_4_;
    auVar22._12_4_ = auVar14._12_4_ + auVar13._12_4_ + auVar15._12_4_ + auVar27._12_4_;
    auVar14._8_4_ = 0x34400002;
    auVar14._0_8_ = 0x3440000234400002;
    auVar14._12_4_ = 0x34400002;
    auVar13 = vmulps_avx512vl(auVar22,auVar14);
    local_90.z = (auVar16._0_4_ + auVar19._0_4_ + auVar21._0_4_ + auVar20._0_4_) * 1.7881396e-07;
    local_90._0_8_ = vmovlps_avx(auVar13);
  }
  local_78 = vucomiss_avx512f(ZEXT416(0x3f800000));
  local_40.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
  .low = auVar25._0_4_ + auVar17._0_4_;
  local_40.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
  .high = auVar26._0_4_ + auVar24._0_4_;
  local_40.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
  .low = auVar18._0_4_ + auVar10._0_4_;
  if ((bVar12) || (bVar11)) {
    local_24.super_Tuple3<pbrt::Point3,_float>.x =
         local_40.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    local_24.super_Tuple3<pbrt::Point3,_float>.y =
         local_40.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    local_24.super_Tuple3<pbrt::Point3,_float>.z =
         local_40.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    Point3fi::Point3fi(&local_40,&local_24,(Vector3f *)&local_90);
    IVar34.high = (float)local_78._0_4_;
    IVar34.low = (float)local_78._0_4_;
    local_78._8_4_ = local_78._0_4_;
    local_78._4_4_ = local_78._0_4_;
    local_78._12_4_ = local_78._0_4_;
    local_58 = Interval<float>::operator/<float>(&local_80,IVar34);
    uStack_50 = extraout_XMM0_Qb;
    local_68 = Interval<float>::operator/<float>(&local_80,(Interval<float>)local_78._0_8_);
    local_80 = local_40.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    uStack_60 = extraout_XMM0_Qb_00;
    auVar35._0_8_ = Interval<float>::operator/<float>(&local_80,(Interval<float>)local_78._0_8_);
    auVar35._8_56_ = extraout_var;
    auVar17._8_8_ = uStack_50;
    auVar17._0_4_ = local_58.low;
    auVar17._4_4_ = local_58.high;
    auVar16._8_8_ = uStack_60;
    auVar16._0_4_ = local_68.low;
    auVar16._4_4_ = local_68.high;
    auVar13 = vunpcklpd_avx(auVar17,auVar16);
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)auVar13._0_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
         (float)(int)((ulong)auVar13._0_8_ >> 0x20);
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)auVar13._8_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
         (float)(int)((ulong)auVar13._8_8_ >> 0x20);
    IVar34 = (Interval<float>)vmovlps_avx(auVar35._0_16_);
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar34;
  }
  else {
    Point3fi::Point3fi(__return_storage_ptr__,(Point3f *)0x58,(Vector3f *)0x8);
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    Point3fi operator()(const Point3fi &p) const {
        Float x = Float(p.x), y = Float(p.y), z = Float(p.z);
        // Compute transformed coordinates from point _pt_
        Float xp = (m[0][0] * x + m[0][1] * y) + (m[0][2] * z + m[0][3]);
        Float yp = (m[1][0] * x + m[1][1] * y) + (m[1][2] * z + m[1][3]);
        Float zp = (m[2][0] * x + m[2][1] * y) + (m[2][2] * z + m[2][3]);
        Float wp = (m[3][0] * x + m[3][1] * y) + (m[3][2] * z + m[3][3]);

        // Compute absolute error for transformed point, _pError_
        Vector3f pError;
        if (p.IsExact()) {
            // Compute error for transformed exact _p_
            pError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));

        } else {
            // Compute error for transformed approximate _p_
            Vector3f pInError = p.Error();
            pError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * pInError.x +
                                         std::abs(m[0][1]) * pInError.y +
                                         std::abs(m[0][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * pInError.x +
                                         std::abs(m[1][1]) * pInError.y +
                                         std::abs(m[1][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * pInError.x +
                                         std::abs(m[2][1]) * pInError.y +
                                         std::abs(m[2][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));
        }

        if (wp == 1)
            return Point3fi(Point3f(xp, yp, zp), pError);
        else
            return Point3fi(Point3f(xp, yp, zp), pError) / wp;
    }